

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionObjects.cpp
# Opt level: O2

ptr<Value> ExceptionObjects::call_failed(string *message)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar1;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"call_failed",&local_39);
  simple_exception(message,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)message;
  return (ptr<Value>)pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> ExceptionObjects::call_failed(const std::string &message) {
    return simple_exception("call_failed", message);
}